

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall Catch::JunitReporter::writeTestCase(JunitReporter *this,TestCaseNode *testCaseNode)

{
  bool bVar1;
  const_reference this_00;
  ulong uVar2;
  long in_RSI;
  vector<Catch::Ptr<Catch::CumulativeReporterBase::SectionNode>,_std::allocator<Catch::Ptr<Catch::CumulativeReporterBase::SectionNode>_>_>
  *in_RDI;
  string className;
  SectionNode *rootSection;
  TestCaseStats *stats;
  SectionNode *in_stack_00000268;
  string *in_stack_00000270;
  string *in_stack_00000278;
  JunitReporter *in_stack_00000280;
  allocator local_71;
  vector<Catch::Ptr<Catch::CumulativeReporterBase::SectionNode>,_std::allocator<Catch::Ptr<Catch::CumulativeReporterBase::SectionNode>_>_>
  *in_stack_ffffffffffffff90;
  string local_40 [32];
  SectionNode *local_20;
  long local_18;
  
  local_18 = in_RSI + 0x10;
  this_00 = std::
            vector<Catch::Ptr<Catch::CumulativeReporterBase::SectionNode>,_std::allocator<Catch::Ptr<Catch::CumulativeReporterBase::SectionNode>_>_>
            ::front(in_RDI);
  local_20 = Ptr<Catch::CumulativeReporterBase::SectionNode>::operator*(this_00);
  std::__cxx11::string::string(local_40,(string *)(local_18 + 0x28));
  uVar2 = std::__cxx11::string::empty();
  if (((uVar2 & 1) != 0) &&
     (bVar1 = std::
              vector<Catch::Ptr<Catch::CumulativeReporterBase::SectionNode>,_std::allocator<Catch::Ptr<Catch::CumulativeReporterBase::SectionNode>_>_>
              ::empty(in_stack_ffffffffffffff90), bVar1)) {
    std::__cxx11::string::operator=(local_40,"global");
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&stack0xffffffffffffff90,"",&local_71);
  writeSection(in_stack_00000280,in_stack_00000278,in_stack_00000270,in_stack_00000268);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffff90);
  std::allocator<char>::~allocator((allocator<char> *)&local_71);
  std::__cxx11::string::~string(local_40);
  return;
}

Assistant:

void writeTestCase( TestCaseNode const& testCaseNode ) {
            TestCaseStats const& stats = testCaseNode.value;

            // All test cases have exactly one section - which represents the
            // test case itself. That section may have 0-n nested sections
            assert( testCaseNode.children.size() == 1 );
            SectionNode const& rootSection = *testCaseNode.children.front();

            std::string className = stats.testInfo.className;

            if( className.empty() ) {
                if( rootSection.childSections.empty() )
                    className = "global";
            }
            writeSection( className, "", rootSection );
        }